

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O2

hashtbl_node_t * hashtbl_get_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len,cf_bool_t create)

{
  byte bVar1;
  int iVar2;
  cf_size_t cVar3;
  hashtbl_node_t *phVar4;
  void *dst;
  hashtbl_node **pphVar5;
  uint uVar6;
  
  if (len == 0xffffffffffffffff) {
    uVar6 = 0;
    for (len = 1; bVar1 = *(byte *)((long)key + (len - 1)), bVar1 != 0; len = len + 1) {
      uVar6 = uVar6 * 0x21 + (uint)bVar1;
    }
  }
  else {
    uVar6 = 0;
    for (cVar3 = 0; len != cVar3; cVar3 = cVar3 + 1) {
      uVar6 = (uint)*(byte *)((long)key + cVar3) + uVar6 * 0x21;
    }
  }
  uVar6 = uVar6 & tbl->hashmsk;
  pphVar5 = tbl->table + uVar6;
  while( true ) {
    phVar4 = *pphVar5;
    if (phVar4 == (hashtbl_node_t *)0x0) {
      if (create == 0) {
        phVar4 = (hashtbl_node_t *)0x0;
      }
      else {
        phVar4 = (hashtbl_node_t *)calloc(1,0x30);
        phVar4->tbl = tbl;
        phVar4->hash = uVar6;
        dst = malloc(len);
        phVar4->key = dst;
        phVar4->keylen = len;
        cf_memcpy_s(dst,len,key,len);
        *pphVar5 = phVar4;
        tbl->size = tbl->size + 1;
      }
      return phVar4;
    }
    if ((((phVar4->hash == uVar6) && (len == phVar4->keylen)) && (phVar4->key != (void *)0x0)) &&
       (iVar2 = bcmp(phVar4->key,key,len), iVar2 == 0)) break;
    pphVar5 = &phVar4->next;
  }
  return phVar4;
}

Assistant:

hashtbl_node_t* hashtbl_get_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len, cf_bool_t create) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         list_entry = &node->next, node = *list_entry) {
        if (node->hash == hash && len == node->keylen
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            return node;
        }
    }

    if (!create) {
        return CF_NULL_PTR;
    }

    node = cf_malloc_z_native(sizeof(hashtbl_node_t));
    node->tbl = tbl;
    node->hash = hash; 
    node->key = cf_malloc_native(len);
    node->keylen = len;
    cf_memcpy_s(node->key, len, key, len);

    *list_entry = node;
    tbl->size++;
    return node;
}